

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

internal * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_(internal *this,TimeInMillis ms)

{
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  long local_18;
  TimeInMillis ms_local;
  
  local_18 = ms;
  ms_local = (TimeInMillis)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,(double)local_18 / 1000.0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << ms/1000.0;
  return ss.str();
}